

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O0

bool __thiscall
bssl::VerifySerialNumber(bssl *this,Input value,bool warnings_only,CertErrors *errors)

{
  Severity SVar1;
  CertErrors *pCVar2;
  bool bVar3;
  uint8_t uVar4;
  size_t sVar5;
  undefined7 in_register_00000009;
  Input in;
  unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> local_68 [3];
  unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> local_50;
  bssl *local_48;
  uchar *local_40;
  byte local_35;
  Severity local_34;
  bool negative;
  CertErrors *pCStack_30;
  Severity error_severity;
  CertErrors *errors_local;
  undefined1 auStack_20 [7];
  bool warnings_only_local;
  Input value_local;
  
  pCStack_30 = (CertErrors *)CONCAT71(in_register_00000009,warnings_only);
  in.data_.data_ = value.data_.data_;
  errors_local._7_1_ = (byte)value.data_.size_ & 1;
  local_34 = (Severity)
             (((undefined1  [16])value.data_ & (undefined1  [16])0x1) != (undefined1  [16])0x0);
  in.data_.size_ = (size_t)&local_35;
  local_48 = this;
  local_40 = in.data_.data_;
  _auStack_20 = this;
  value_local.data_.data_ = in.data_.data_;
  bVar3 = der::IsValidInteger((der *)this,in,(bool *)0x1);
  pCVar2 = pCStack_30;
  SVar1 = local_34;
  if (bVar3) {
    if ((local_35 & 1) != 0) {
      CertErrors::AddWarning(pCStack_30,"Serial number is negative");
    }
    sVar5 = der::Input::size((Input *)auStack_20);
    if ((sVar5 == 1) && (uVar4 = der::Input::operator[]((Input *)auStack_20,0), uVar4 == '\0')) {
      CertErrors::AddWarning(pCStack_30,"Serial number is zero");
    }
    sVar5 = der::Input::size((Input *)auStack_20);
    pCVar2 = pCStack_30;
    SVar1 = local_34;
    if (sVar5 < 0x15) {
      value_local.data_.size_._7_1_ = true;
    }
    else {
      sVar5 = der::Input::size((Input *)auStack_20);
      CreateCertErrorParams1SizeT((bssl *)local_68,"length",sVar5);
      CertErrors::Add(pCVar2,SVar1,"Serial number is longer than 20 octets",local_68);
      ::std::unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>::
      ~unique_ptr(local_68);
      value_local.data_.size_._7_1_ = false;
    }
  }
  else {
    ::std::unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>>::
    unique_ptr<std::default_delete<bssl::CertErrorParams>,void>
              ((unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>> *)
               &local_50,(nullptr_t)0x0);
    CertErrors::Add(pCVar2,SVar1,"Serial number is not a valid INTEGER",&local_50);
    ::std::unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>::
    ~unique_ptr(&local_50);
    value_local.data_.size_._7_1_ = false;
  }
  return value_local.data_.size_._7_1_;
}

Assistant:

bool VerifySerialNumber(der::Input value, bool warnings_only,
                        CertErrors *errors) {
  // If |warnings_only| was set to true, the exact same errors will be logged,
  // only they will be logged with a lower severity (warning rather than error).
  CertError::Severity error_severity =
      warnings_only ? CertError::SEVERITY_WARNING : CertError::SEVERITY_HIGH;

  bool negative;
  if (!der::IsValidInteger(value, &negative)) {
    errors->Add(error_severity, kSerialNumberNotValidInteger, nullptr);
    return false;
  }

  // RFC 5280 section 4.1.2.2:
  //
  //    Note: Non-conforming CAs may issue certificates with serial numbers
  //    that are negative or zero.  Certificate users SHOULD be prepared to
  //    gracefully handle such certificates.
  if (negative) {
    errors->AddWarning(kSerialNumberIsNegative);
  }
  if (value.size() == 1 && value[0] == 0) {
    errors->AddWarning(kSerialNumberIsZero);
  }

  // RFC 5280 section 4.1.2.2:
  //
  //    Certificate users MUST be able to handle serialNumber values up to 20
  //    octets. Conforming CAs MUST NOT use serialNumber values longer than 20
  //    octets.
  if (value.size() > 20) {
    errors->Add(error_severity, kSerialNumberLengthOver20,
                CreateCertErrorParams1SizeT("length", value.size()));
    return false;
  }

  return true;
}